

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

void __thiscall aeron::archive::Configuration::Configuration(Configuration *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char **arg;
  char **arg_00;
  char **arg_01;
  char **arg_02;
  char *evv_1;
  char *evv;
  
  (this->controlChannel)._M_dataplus._M_p = (pointer)&(this->controlChannel).field_2;
  (this->controlChannel)._M_string_length = 0;
  (this->controlChannel).field_2._M_local_buf[0] = '\0';
  (this->localControlChannel)._M_dataplus._M_p = (pointer)&(this->localControlChannel).field_2;
  (this->localControlChannel)._M_string_length = 0;
  (this->localControlChannel).field_2._M_local_buf[0] = '\0';
  (this->controlResponseChannel)._M_dataplus._M_p = (pointer)&(this->controlResponseChannel).field_2
  ;
  (this->controlResponseChannel)._M_string_length = 0;
  (this->controlResponseChannel).field_2._M_local_buf[0] = '\0';
  (this->recordingEventsChannel)._M_dataplus._M_p = (pointer)&(this->recordingEventsChannel).field_2
  ;
  (this->recordingEventsChannel)._M_string_length = 0;
  (this->recordingEventsChannel).field_2._M_local_buf[0] = '\0';
  evv = getenv("AERON_ARCHIVE_MESSAGE_TIMEOUT");
  if (evv == (char *)0x0) {
    lVar3 = 5000000000;
  }
  else {
    lVar3 = boost::lexical_cast<long,char*>(&evv);
  }
  this->messageTimeoutNs = lVar3;
  evv_1 = getenv("AERON_ARCHIVE_CONTROL_CHANNEL");
  if (evv_1 == (char *)0x0) {
    (anonymous_namespace)::ControlChannel::defaultValue_abi_cxx11_();
  }
  else {
    boost::lexical_cast<std::__cxx11::string,char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&evv,
               (boost *)&evv_1,arg);
  }
  std::__cxx11::string::operator=((string *)&this->controlChannel,(string *)&evv);
  std::__cxx11::string::~string((string *)&evv);
  evv = getenv("AERON_ARCHIVE_CONTROL_STREAM_ID");
  if (evv == (char *)0x0) {
    iVar2 = 10;
  }
  else {
    iVar2 = boost::lexical_cast<int,char*>(&evv);
  }
  this->controlStreamId = iVar2;
  evv_1 = getenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL");
  if (evv_1 == (char *)0x0) {
    (anonymous_namespace)::LocalControlChannel::defaultValue_abi_cxx11_();
  }
  else {
    boost::lexical_cast<std::__cxx11::string,char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&evv,
               (boost *)&evv_1,arg_00);
  }
  std::__cxx11::string::operator=((string *)&this->localControlChannel,(string *)&evv);
  std::__cxx11::string::~string((string *)&evv);
  evv = getenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID");
  if (evv == (char *)0x0) {
    iVar2 = 0xb;
  }
  else {
    iVar2 = boost::lexical_cast<int,char*>(&evv);
  }
  this->localControlStreamId = iVar2;
  evv_1 = getenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL");
  if (evv_1 == (char *)0x0) {
    (anonymous_namespace)::ControlResponseChannel::defaultValue_abi_cxx11_();
  }
  else {
    boost::lexical_cast<std::__cxx11::string,char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&evv,
               (boost *)&evv_1,arg_01);
  }
  std::__cxx11::string::operator=((string *)&this->controlResponseChannel,(string *)&evv);
  std::__cxx11::string::~string((string *)&evv);
  evv = getenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID");
  if (evv == (char *)0x0) {
    iVar2 = 0x14;
  }
  else {
    iVar2 = boost::lexical_cast<int,char*>(&evv);
  }
  this->controlResponseStreamId = iVar2;
  evv_1 = getenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL");
  if (evv_1 == (char *)0x0) {
    (anonymous_namespace)::RecordingEventsChannel::defaultValue_abi_cxx11_();
  }
  else {
    boost::lexical_cast<std::__cxx11::string,char*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&evv,
               (boost *)&evv_1,arg_02);
  }
  std::__cxx11::string::operator=((string *)&this->recordingEventsChannel,(string *)&evv);
  std::__cxx11::string::~string((string *)&evv);
  evv = getenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID");
  if (evv == (char *)0x0) {
    iVar2 = 0x1e;
  }
  else {
    iVar2 = boost::lexical_cast<int,char*>(&evv);
  }
  this->recordingEventsStreamId = iVar2;
  evv = getenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE");
  if (evv == (char *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = boost::lexical_cast<bool,char*>(&evv);
  }
  this->controlTermBufferSparse = bVar1;
  evv = getenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH");
  if (evv == (char *)0x0) {
    iVar2 = 0x10000;
  }
  else {
    iVar2 = boost::lexical_cast<int,char*>(&evv);
  }
  this->controlTermBufferLength = iVar2;
  evv = getenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH");
  if (evv == (char *)0x0) {
    iVar2 = 0x580;
  }
  else {
    iVar2 = boost::lexical_cast<int,char*>(&evv);
  }
  this->controlMtuLength = iVar2;
  return;
}

Assistant:

Configuration::Configuration() {
    messageTimeoutNs = getMessageTimeout();
    controlChannel = getControlChannel();
    controlStreamId = getControlStreamId();
    localControlChannel = getLocalControlChannel();
    localControlStreamId = getLocalControlStreamId();
    controlResponseChannel = getControlResponseChannel();
    controlResponseStreamId = getControlResponseStreamId();
    recordingEventsChannel = getRecordingEventsChannel();
    recordingEventsStreamId = getRecordingEventsStreamId();
    controlTermBufferSparse = getControlTermBufferSparse();
    controlTermBufferLength = getControlTermBufferLength();
    controlMtuLength = getControlMtuLength();
}